

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lminiz.c
# Opt level: O2

int lmz_reader_close(lua_State *L)

{
  mz_zip_archive *pZip;
  
  pZip = (mz_zip_archive *)luaL_checkudata(L,1,"miniz_reader");
  uv_fs_close((uv_loop_t *)pZip[1].m_archive_size,(uv_fs_t *)&pZip[1].m_central_directory_file_ofs,
              *(uv_file *)&pZip[5].m_pRead,(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)&pZip[1].m_central_directory_file_ofs);
  mz_zip_reader_end(pZip);
  return 0;
}

Assistant:

static int lmz_reader_close(lua_State *L) {
	lmz_file_t* zip = luaL_checkudata(L, 1, MZ_READER_NAME);

	if (zip->rawdata) {
		free(zip->rawdata);
		zip->rawdata = NULL;
		zip->rawlen = 0;
	}

	if (zip->fd > 0) {
		uv_fs_close(zip->loop, &(zip->req), zip->fd, NULL);
		uv_fs_req_cleanup(&(zip->req));
		zip->fd = -1;
	}

	mz_zip_reader_end(&(zip->archive));
	return 0;
}